

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

uint32_t helper_float_cvt_w_d_mips64el(CPUMIPSState_conflict10 *env,uint64_t fdt0)

{
  uint32_t uVar1;
  uintptr_t unaff_retaddr;
  
  uVar1 = float64_to_int32_mips64el(fdt0,&(env->active_fpu).fp_status);
  if (((env->active_fpu).fp_status.float_exception_flags & 9) != 0) {
    uVar1 = 0x7fffffff;
  }
  update_fcr31(env,unaff_retaddr);
  return uVar1;
}

Assistant:

uint32_t helper_float_cvt_w_d(CPUMIPSState *env, uint64_t fdt0)
{
    uint32_t wt2;

    wt2 = float64_to_int32(fdt0, &env->active_fpu.fp_status);
    if (get_float_exception_flags(&env->active_fpu.fp_status)
        & (float_flag_invalid | float_flag_overflow)) {
        wt2 = FP_TO_INT32_OVERFLOW;
    }
    update_fcr31(env, GETPC());
    return wt2;
}